

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::bb::(anonymous_namespace)::getShaderName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BufferBlock *block,
          int instanceNdx,BufferVar *var,TypeComponentVector *accessPath)

{
  char *pcVar1;
  _Alloc_hider __s;
  undefined8 uVar2;
  size_t sVar3;
  ostream *poVar4;
  string *psVar5;
  undefined4 in_register_0000000c;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarType curType;
  ostringstream name;
  string *local_1c8;
  VarType local_1c0;
  undefined1 local_1a8 [376];
  
  end._M_current = (VarTypeComponent *)var;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = *(char **)(this + 0x20);
  if (pcVar1 != (char *)0x0 && *(long *)(this + 0x28) != 0) {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar3);
    if (0 < *(int *)(this + 0x58)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
      poVar4 = (ostream *)std::ostream::operator<<(local_1a8,(int)block);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
  }
  pcVar1 = *(char **)CONCAT44(in_register_0000000c,instanceNdx);
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar3);
  }
  begin._M_current = (VarTypeComponent *)(var->m_name)._M_dataplus._M_p;
  local_1c8 = __return_storage_ptr__;
  if (begin._M_current != (VarTypeComponent *)(var->m_name)._M_string_length) {
    do {
      if ((begin._M_current)->type == ARRAY_ELEMENT) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(begin._M_current)->index)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      }
      else if ((begin._M_current)->type == STRUCT_MEMBER) {
        glu::
        getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                  (&local_1c0,(glu *)((undefined8 *)CONCAT44(in_register_0000000c,instanceNdx) + 4),
                   (VarType *)(var->m_name)._M_dataplus._M_p,begin,end);
        uVar2 = local_1c0.m_data.basic;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
        __s._M_p = (((StructType *)uVar2)->m_members).
                   super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl
                   .super__Vector_impl_data._M_start[(begin._M_current)->index].m_name._M_dataplus.
                   _M_p;
        if (__s._M_p == (char *)0x0) {
          std::ios::clear((int)&local_1c8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x20);
        }
        else {
          sVar3 = strlen(__s._M_p);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s._M_p,sVar3);
        }
        glu::VarType::~VarType(&local_1c0);
      }
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != (VarTypeComponent *)(var->m_name)._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar5 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar5;
}

Assistant:

string getShaderName (const BufferBlock& block, int instanceNdx, const BufferVar& var, const glu::TypeComponentVector& accessPath)
{
	std::ostringstream name;

	if (block.getInstanceName())
	{
		name << block.getInstanceName();

		if (block.isArray())
			name << "[" << instanceNdx << "]";

		name << ".";
	}
	else
		DE_ASSERT(instanceNdx == 0);

	name << var.getName();

	for (glu::TypeComponentVector::const_iterator pathComp = accessPath.begin(); pathComp != accessPath.end(); pathComp++)
	{
		if (pathComp->type == glu::VarTypeComponent::STRUCT_MEMBER)
		{
			const VarType		curType		= glu::getVarType(var.getType(), accessPath.begin(), pathComp);
			const StructType*	structPtr	= curType.getStructPtr();

			name << "." << structPtr->getMember(pathComp->index).getName();
		}
		else if (pathComp->type == glu::VarTypeComponent::ARRAY_ELEMENT)
			name << "[" << pathComp->index << "]";
		else
			DE_ASSERT(false);
	}

	return name.str();
}